

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accumulate.cc
# Opt level: O1

void accumulate_avg(vw *all,parameters *weights,size_t offset)

{
  float fVar1;
  uint32_t uVar2;
  ulong uVar3;
  uint64_t i_2;
  float *buffer;
  weight *pwVar4;
  uint64_t i_1;
  uint64_t i;
  size_t sVar5;
  size_t n;
  float fVar6;
  
  n = 1L << ((byte)all->num_bits & 0x3f);
  fVar6 = (float)all->all_reduce->total;
  buffer = (float *)operator_new__(n * 4);
  if (weights->sparse == false) {
    uVar2 = (weights->dense_weights)._stride_shift;
    uVar3 = (weights->dense_weights)._weight_mask;
    pwVar4 = (weights->dense_weights)._begin;
    sVar5 = 0;
    do {
      buffer[sVar5] = pwVar4[offset + (sVar5 << ((byte)uVar2 & 0x3f) & uVar3)];
      sVar5 = sVar5 + 1;
    } while (n != sVar5);
  }
  else {
    sVar5 = 0;
    do {
      pwVar4 = sparse_parameters::operator[]
                         (&weights->sparse_weights,
                          sVar5 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f));
      buffer[sVar5] = pwVar4[offset];
      sVar5 = sVar5 + 1;
    } while (n != sVar5);
  }
  all_reduce<float,_&add_float>(all,buffer,n);
  if (weights->sparse == false) {
    sVar5 = 0;
    do {
      (weights->dense_weights)._begin
      [(sVar5 << ((byte)(weights->dense_weights)._stride_shift & 0x3f) &
       (weights->dense_weights)._weight_mask) + offset] = buffer[sVar5] / fVar6;
      sVar5 = sVar5 + 1;
    } while (n != sVar5);
  }
  else {
    sVar5 = 0;
    do {
      fVar1 = buffer[sVar5];
      pwVar4 = sparse_parameters::operator[]
                         (&weights->sparse_weights,
                          sVar5 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f));
      pwVar4[offset] = fVar1 / fVar6;
      sVar5 = sVar5 + 1;
    } while (n != sVar5);
  }
  operator_delete__(buffer);
  return;
}

Assistant:

void accumulate_avg(vw& all, parameters& weights, size_t offset)
{
  uint32_t length = 1 << all.num_bits;  // This is size of gradient
  float numnodes = (float)all.all_reduce->total;
  float* local_grad = new float[length];

  if (weights.sparse)
    for (uint64_t i = 0; i < length; i++)
      local_grad[i] = (&(weights.sparse_weights[i << weights.sparse_weights.stride_shift()]))[offset];
  else
    for (uint64_t i = 0; i < length; i++)
      local_grad[i] = (&(weights.dense_weights[i << weights.dense_weights.stride_shift()]))[offset];

  all_reduce<float, add_float>(all, local_grad, length);  // TODO: modify to not use first()

  if (weights.sparse)
    for (uint64_t i = 0; i < length; i++)
      (&(weights.sparse_weights[i << weights.sparse_weights.stride_shift()]))[offset] = local_grad[i] / numnodes;
  else
    for (uint64_t i = 0; i < length; i++)
      (&(weights.dense_weights[i << weights.dense_weights.stride_shift()]))[offset] = local_grad[i] / numnodes;

  delete[] local_grad;
}